

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void andres::marray_detail::
     operate<andres::marray_detail::Assign<int,int>,int,std::allocator<unsigned_long>,andres::BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Times<int,int,int>>,int>
               (View<int,_false,_std::allocator<unsigned_long>_> *v,ViewExpression *expression)

{
  CoordinateOrder CVar1;
  value_type vVar2;
  undefined8 uVar3;
  bool bVar4;
  BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
  *this;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  CoordinateOrder *pCVar8;
  reference pvVar9;
  bool local_121;
  bool local_111;
  size_type local_110;
  size_t j_2;
  size_type local_100;
  size_t maxDimension;
  undefined1 local_f0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> coordinate;
  size_t offsetV;
  ExpressionIterator itE;
  ulong local_a0;
  size_t j_1;
  allocator<int> local_79;
  undefined1 local_78 [8];
  Marray<int,_std::allocator<unsigned_long>_> m;
  size_t j;
  BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
  *e;
  ViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
  *expression_local;
  View<int,_false,_std::allocator<unsigned_long>_> *v_local;
  
  this = ViewExpression::operator_cast_to_BinaryViewExpressionScalarFirst_(expression);
  sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::size(v);
  local_111 = false;
  if (sVar5 != 0) {
    sVar5 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
            ::size(this);
    local_111 = sVar5 != 0;
  }
  Assert<bool>(local_111);
  sVar5 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
          ::dimension(this);
  sVar6 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
  Assert<bool>(sVar5 == sVar6);
  sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar5 == 0) {
    sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::size(v);
    local_121 = false;
    if (sVar5 == 1) {
      sVar5 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
              ::size(this);
      local_121 = sVar5 == 1;
    }
    Assert<bool>(local_121);
  }
  else {
    for (m._64_8_ = 0; uVar3 = m._64_8_,
        sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v), (ulong)uVar3 < sVar5
        ; m._64_8_ = m._64_8_ + 1) {
      sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,m._64_8_);
      sVar6 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
              ::shape(this,m._64_8_);
      Assert<bool>(sVar5 == sVar6);
    }
  }
  bVar4 = BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Times<int,int,int>>
          ::overlaps<int,false,std::allocator<unsigned_long>>
                    ((BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Times<int,int,int>>
                      *)this,v);
  if (bVar4) {
    std::allocator<int>::allocator(&local_79);
    Marray<int,std::allocator<unsigned_long>>::
    Marray<andres::BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Times<int,int,int>>,int>
              ((Marray<int,std::allocator<unsigned_long>> *)local_78,
               (ViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                *)this,&local_79);
    std::allocator<int>::~allocator(&local_79);
    operate<andres::marray_detail::Assign<int,int>,int,int,false,std::allocator<unsigned_long>>
              (v,local_78);
    Marray<int,_std::allocator<unsigned_long>_>::~Marray
              ((Marray<int,_std::allocator<unsigned_long>_> *)local_78);
  }
  else {
    sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar5 != 0) {
      bVar4 = View<int,_false,_std::allocator<unsigned_long>_>::isSimple(v);
      if ((bVar4) &&
         (bVar4 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                  ::isSimple(this), bVar4)) {
        pCVar8 = View<int,_false,_std::allocator<unsigned_long>_>::coordinateOrder(v);
        CVar1 = *pCVar8;
        pCVar8 = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                 ::coordinateOrder(this);
        if (CVar1 == *pCVar8) {
          for (local_a0 = 0; sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::size(v),
              local_a0 < sVar5; local_a0 = local_a0 + 1) {
            piVar7 = View<int,_false,_std::allocator<unsigned_long>_>::operator[](v,local_a0);
            itE.iterator_.offset_._4_4_ =
                 BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                 ::operator[](this,local_a0);
            Assign<int,_int>::operator()
                      ((Assign<int,_int> *)((long)&v_local + 7),piVar7,
                       (int *)((long)&itE.iterator_.offset_ + 4));
          }
          return;
        }
      }
      BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
      ::ExpressionIterator::ExpressionIterator((ExpressionIterator *)&offsetV,this);
      coordinate.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      std::allocator<unsigned_long>::allocator
                ((allocator<unsigned_long> *)((long)&maxDimension + 7));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,sVar5,
                 (allocator<unsigned_long> *)((long)&maxDimension + 7));
      std::allocator<unsigned_long>::~allocator
                ((allocator<unsigned_long> *)((long)&maxDimension + 7));
      sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      local_100 = sVar5 - 1;
      do {
        piVar7 = View<int,_false,_std::allocator<unsigned_long>_>::operator[]
                           (v,(size_t)coordinate.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        j_2._4_4_ = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                    ::ExpressionIterator::operator*((ExpressionIterator *)&offsetV);
        Assign<int,_int>::operator()
                  ((Assign<int,_int> *)((long)&v_local + 7),piVar7,(int *)((long)&j_2 + 4));
        for (local_110 = 0; sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v),
            local_110 < sVar5; local_110 = local_110 + 1) {
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,
                              local_110);
          vVar2 = *pvVar9;
          sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,local_110);
          if (vVar2 + 1 != sVar5) {
            sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,local_110);
            coordinate.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)((long)coordinate.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + sVar5);
            BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
            ::ExpressionIterator::incrementCoordinate((ExpressionIterator *)&offsetV,local_110);
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,
                                local_110);
            *pvVar9 = *pvVar9 + 1;
            break;
          }
          if (local_110 == local_100) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
            return;
          }
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,
                              local_110);
          vVar2 = *pvVar9;
          sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,local_110);
          coordinate.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)coordinate.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage - vVar2 * sVar5);
          BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
          ::ExpressionIterator::resetCoordinate((ExpressionIterator *)&offsetV,local_110);
          pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,
                              local_110);
          *pvVar9 = 0;
        }
      } while( true );
    }
    piVar7 = View<int,_false,_std::allocator<unsigned_long>_>::operator[](v,0);
    j_1._4_4_ = BinaryViewExpressionScalarFirst<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                ::operator[](this,0);
    Assign<int,_int>::operator()
              ((Assign<int,_int> *)((long)&v_local + 7),piVar7,(int *)((long)&j_1 + 4));
  }
  return;
}

Assistant:

inline void operate
(
    View<T1, false, A>& v, 
    const ViewExpression<E, T2>& expression, 
    Functor f
)
{
    const E& e = expression; // cast
    if(!MARRAY_NO_DEBUG) {
        Assert(v.size() != 0 && e.size() != 0);
        Assert(e.dimension() == v.dimension());
        if(v.dimension() == 0) {
            Assert(v.size() == 1 && e.size() == 1);
        }
        else {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == e.shape(j));
            }
        }
    }
    if(e.overlaps(v)) {
        Marray<T1, A> m(e); // temporary copy
        operate(v, m, f);
    }
    else if(v.dimension() == 0) {
        f(v[0], e[0]);
    }
    else if(v.isSimple() && e.isSimple() 
    && v.coordinateOrder() == e.coordinateOrder()) {
        for(std::size_t j=0; j<v.size(); ++j) {
            f(v[j], e[j]);
        }
    }
    else {
        // loop unrolling does not improve performance here
        typename E::ExpressionIterator itE(e);
        std::size_t offsetV = 0;
        std::vector<std::size_t> coordinate(v.dimension());
        std::size_t maxDimension = v.dimension() - 1;
        for(;;) {
            f(v[offsetV], *itE);
            for(std::size_t j=0; j<v.dimension(); ++j) {
                if(coordinate[j]+1 == v.shape(j)) {
                    if(j == maxDimension) {
                        return;
                    }
                    else {
                        offsetV -= coordinate[j] * v.strides(j);
                        itE.resetCoordinate(j);
                        coordinate[j] = 0;
                    }
                }
                else {
                    offsetV += v.strides(j);
                    itE.incrementCoordinate(j);
                    ++coordinate[j];
                    break;
                }
            }
        }
    }
}